

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseElementName(Parser *this,QString *name)

{
  long lVar1;
  TokenType TVar2;
  Symbol *pSVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (long)this->index + -1;
  if (lVar1 < (this->symbols).d.size) {
    pSVar3 = (this->symbols).d.ptr;
    TVar2 = pSVar3[lVar1].token;
    if (TVar2 == IDENT) {
      Symbol::lexem(&local_38,pSVar3 + (long)this->index + -1);
      pQVar4 = &((name->d).d)->super_QArrayData;
      pcVar5 = (name->d).ptr;
      (name->d).d = local_38.d.d;
      (name->d).ptr = local_38.d.ptr;
      qVar6 = (name->d).size;
      (name->d).size = local_38.d.size;
      local_38.d.d = (Data *)pQVar4;
      local_38.d.ptr = pcVar5;
      local_38.d.size = qVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      bVar7 = true;
      goto LAB_005e36e9;
    }
    if (TVar2 == STAR) {
      bVar7 = true;
      if ((name->d).ptr != (char16_t *)0x0) {
        pQVar4 = &((name->d).d)->super_QArrayData;
        (name->d).d = (Data *)0x0;
        (name->d).ptr = (char16_t *)0x0;
        (name->d).size = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      goto LAB_005e36e9;
    }
  }
  bVar7 = false;
LAB_005e36e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseElementName(QString *name)
{
    switch (lookup()) {
        case STAR: name->clear(); break;
        case IDENT: *name = lexem(); break;
        default: return false;
    }
    return true;
}